

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O1

int Abc_FlowRetime_VerifyPathLatencies_rec(Abc_Obj_t *pObj,int markD)

{
  Abc_Obj_t *pObj_00;
  bool bVar1;
  uint uVar2;
  char *__s;
  uint uVar3;
  long lVar4;
  
  uVar2 = *(uint *)&pObj->field_0x14;
  uVar3 = uVar2 >> 6 & 1;
  bVar1 = true;
  if ((uVar2 & 0x20) == 0) {
    *(uint *)&pObj->field_0x14 = uVar2 | 0x20;
    if ((uVar2 & 0xf) == 8) {
      uVar3 = 1;
    }
    if ((((uVar2 & 0xf) != 3) && (pManMR->fIsForward == 0)) && ((pObj->vFanouts).nSize == 0)) {
      return -1;
    }
    if (0 < (pObj->vFanouts).nSize) {
      lVar4 = 0;
      bVar1 = false;
      do {
        pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar4]];
        uVar2 = *(uint *)&pObj_00->field_0x14 & 0xf;
        if (uVar2 == 5) {
LAB_004d1080:
          if ((markD == 0) && ((*(uint *)&pObj->field_0x14 & 0xf) != 8)) {
            __s = "\nERROR: no-latch path (end)";
LAB_004d10b7:
            puts(__s);
            print_node(pObj_00);
            putchar(10);
            fPathError = 1;
          }
        }
        else {
          if (pManMR->fIsForward == 0) {
            if (uVar2 == 3) {
              if ((markD != 0) || ((*(uint *)&pObj->field_0x14 & 0xf) == 8)) {
                __s = "\nERROR: extra-latch path to outputs";
                goto LAB_004d10b7;
              }
              goto LAB_004d1110;
            }
          }
          else if (uVar2 == 3) goto LAB_004d1080;
          uVar2 = 1;
          if (markD == 0) {
            uVar2 = (uint)((*(uint *)&pObj->field_0x14 & 0xf) == 8);
          }
          uVar2 = Abc_FlowRetime_VerifyPathLatencies_rec(pObj_00,uVar2);
          if ((int)uVar2 < 0) {
            uVar2 = 0;
          }
          else {
            bVar1 = true;
          }
          uVar3 = uVar3 | uVar2;
        }
LAB_004d1110:
        if (fPathError != 0) {
          print_node(pObj);
          putchar(10);
          return 0;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < (pObj->vFanouts).nSize);
      bVar1 = !bVar1;
    }
  }
  uVar2 = 0xffffffff;
  if (!bVar1) {
    if ((markD != 0) && (uVar3 != 0)) {
      puts("\nERROR: mult-latch path");
      print_node(pObj);
      putchar(10);
      fPathError = 1;
    }
    if (markD == 0 && uVar3 == 0) {
      puts("\nERROR: no-latch path (inter)");
      print_node(pObj);
      putchar(10);
      fPathError = 1;
    }
    uVar2 = uVar3 & 1;
    *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xffffffbf | uVar2 << 6;
  }
  return uVar2;
}

Assistant:

int
Abc_FlowRetime_VerifyPathLatencies_rec( Abc_Obj_t * pObj, int markD ) {
  int i, j;
  Abc_Obj_t *pNext;
  int fCare = 0;
  int markC = pObj->fMarkC;

  if (!pObj->fMarkB) {
    pObj->fMarkB = 1; // visited
    
    if (Abc_ObjIsLatch(pObj))
      markC = 1;      // latch in output
    
    if (!pManMR->fIsForward && !Abc_ObjIsPo(pObj) && !Abc_ObjFanoutNum(pObj))
      return -1; // dangling non-PO outputs : don't care what happens
    
    Abc_ObjForEachFanout( pObj, pNext, i ) {
      // reached end of cycle?
      if ( Abc_ObjIsBo(pNext) ||
           (pManMR->fIsForward && Abc_ObjIsPo(pNext)) ) {
        if (!markD && !Abc_ObjIsLatch(pObj)) {
          printf("\nERROR: no-latch path (end)\n");
          print_node(pNext);
          printf("\n");
          fPathError = 1;
        }
      } else if (!pManMR->fIsForward && Abc_ObjIsPo(pNext)) {
        if (markD || Abc_ObjIsLatch(pObj)) {
          printf("\nERROR: extra-latch path to outputs\n");
          print_node(pNext);
          printf("\n");
          fPathError = 1;
        }
      } else {
        j = Abc_FlowRetime_VerifyPathLatencies_rec( pNext, markD || Abc_ObjIsLatch(pObj) );
        if (j >= 0) {
          markC |= j;
          fCare = 1;
        }
      }

      if (fPathError) {
        print_node(pObj);
        printf("\n");
        return 0;
      }
    }
  }

  if (!fCare) return -1;

  if (markC && markD) {
    printf("\nERROR: mult-latch path\n");
    print_node(pObj);
    printf("\n");
    fPathError = 1;
  }
  if (!markC && !markD) {
    printf("\nERROR: no-latch path (inter)\n");
    print_node(pObj);
    printf("\n");
    fPathError = 1;
  }

  return (pObj->fMarkC = markC);
}